

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::NegativeGLSLCompileTime::Run(NegativeGLSLCompileTime *this)

{
  pointer pcVar1;
  ostream *this_00;
  bool bVar2;
  ostream *poVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar4;
  int extraout_EDX_01;
  int extraout_EDX_02;
  long lVar5;
  GLint bindings;
  uint local_1d4;
  undefined1 local_1d0 [128];
  ios_base local_150 [264];
  string local_48;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90dd,(GLint *)&local_1d4);
  pcVar1 = local_1d0 + 0x10;
  local_1d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"\nbuffer Buffer { int x = 10; };\nvoid main() {\n  x = 0;\n}","");
  bVar2 = Compile(this,(string *)local_1d0);
  iVar4 = extraout_EDX;
  if ((pointer)local_1d0._0_8_ != pcVar1) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    iVar4 = extraout_EDX_00;
  }
  lVar5 = -1;
  if (bVar2) {
    gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
              ((string *)local_1d0,(NegativeGLSLCompileTime *)0xffffffff,iVar4);
    bVar2 = Compile(this,(string *)local_1d0);
    iVar4 = extraout_EDX_01;
    if ((pointer)local_1d0._0_8_ != pcVar1) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      iVar4 = extraout_EDX_02;
    }
    if (bVar2) {
      gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
                ((string *)local_1d0,(NegativeGLSLCompileTime *)(ulong)local_1d4,iVar4);
      bVar2 = Compile(this,(string *)local_1d0);
      if ((pointer)local_1d0._0_8_ != pcVar1) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      if (bVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
        this_00 = (ostream *)(local_1d0 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(this_00,"\nlayout(binding = ",0x12);
        poVar3 = (ostream *)std::ostream::operator<<(this_00,local_1d4 - 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,
                   ") buffer Buffer {\n  int x;\n} g_array[4];\nvoid main() {\n  g_array[0].x = 0;\n  g_array[1].x = 0;\n  g_array[2].x = 0;\n  g_array[3].x = 0;\n}"
                   ,0x88);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1d0);
        std::ios_base::~ios_base(local_150);
        bVar2 = Compile(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_1d0._0_8_ = this_00;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"\nbuffer int x;\nvoid main() {\n  x = 0;\n}","");
          bVar2 = Compile(this,(string *)local_1d0);
          if ((ostream *)local_1d0._0_8_ != this_00) {
            operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
          }
          if (bVar2) {
            local_1d0._0_8_ = this_00;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1d0,
                       "\nbuffer Buffer { int y; };\nvoid main() {\n  y = 0;\n  buffer int x = 0;\n}"
                       ,"");
            bVar2 = Compile(this,(string *)local_1d0);
            if ((ostream *)local_1d0._0_8_ != this_00) {
              operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
            }
            if (bVar2) {
              local_1d0._0_8_ = this_00;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1d0,
                         "\nbuffer Buffer { int y; };\nvoid Modify(buffer int a) {\n  atomicAdd(a, 1);\n}\nvoid main() {\n  Modify(y);\n}"
                         ,"");
              bVar2 = Compile(this,(string *)local_1d0);
              if ((ostream *)local_1d0._0_8_ != this_00) {
                operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
              }
              if (bVar2) {
                local_1d0._0_8_ = this_00;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1d0,
                           "\nlayout(std430) uniform UBO { int x; };\nbuffer SSBO { int y; };\nvoid main() {\n  y = x;\n}"
                           ,"");
                bVar2 = Compile(this,(string *)local_1d0);
                if ((ostream *)local_1d0._0_8_ != this_00) {
                  operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                }
                if (bVar2) {
                  local_1d0._0_8_ = this_00;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1d0,
                             "\nbuffer SSBO {\n  layout(std430) int x;\n};\nvoid main() {\n  x = 0;\n}"
                             ,"");
                  bVar2 = Compile(this,(string *)local_1d0);
                  if ((ostream *)local_1d0._0_8_ != this_00) {
                    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                  }
                  if (bVar2) {
                    local_1d0._0_8_ = this_00;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1d0,
                               "\nbuffer SSBO {\n  layout(binding = 1) int x;\n};\nvoid main() {\n  x = 0;\n}"
                               ,"");
                    bVar2 = Compile(this,(string *)local_1d0);
                    if ((ostream *)local_1d0._0_8_ != this_00) {
                      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                    }
                    if (bVar2) {
                      local_1d0._0_8_ = this_00;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1d0,
                                 "\nreadonly buffer SSBO {\n  int x;\n};\nvoid main() {\n  x = 0;\n}"
                                 ,"");
                      bVar2 = Compile(this,(string *)local_1d0);
                      if ((ostream *)local_1d0._0_8_ != this_00) {
                        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                      }
                      if (bVar2) {
                        local_1d0._0_8_ = this_00;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1d0,
                                   "\nbuffer SSBO {\n  int x;\n};\nwriteonly buffer SSBO2 {\n  int y;\n};\nvoid main() {\n  x = y;\n}"
                                   ,"");
                        bVar2 = Compile(this,(string *)local_1d0);
                        if ((ostream *)local_1d0._0_8_ != this_00) {
                          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                        }
                        if (bVar2) {
                          local_1d0._0_8_ = this_00;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1d0,
                                     "\nbuffer SSBO {\n  int x;\n};\nbuffer SSBO2 {\n  writeonly int y;\n  readonly int z;\n};\nvoid main() {\n  x = y;\n  z = 0;\n}"
                                     ,"");
                          bVar2 = Compile(this,(string *)local_1d0);
                          if ((ostream *)local_1d0._0_8_ != this_00) {
                            operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                          }
                          if (bVar2) {
                            local_1d0._0_8_ = this_00;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_1d0,
                                       "\nbuffer SSBO {\n  int x;\n};\nreadonly buffer SSBO2 {\n  writeonly int y;\n};\nvoid main() {\n  x = y;\n}"
                                       ,"");
                            bVar2 = Compile(this,(string *)local_1d0);
                            if ((ostream *)local_1d0._0_8_ != this_00) {
                              operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                            }
                            if (bVar2) {
                              local_1d0._0_8_ = this_00;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_1d0,
                                         "\nlayout(binding = 1) buffer;\nbuffer SSBO {\n  int x;\n};\nvoid main() {\n  x = 0;\n}"
                                         ,"");
                              bVar2 = Compile(this,(string *)local_1d0);
                              if ((ostream *)local_1d0._0_8_ != this_00) {
                                operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                              }
                              if (bVar2) {
                                local_1d0._0_8_ = this_00;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_1d0,
                                           "\nbuffer Buffer { int x; };\nint y;\nvoid main() {\n  atomicAdd(x, 1);\n  atomicAdd(y, 2);\n}"
                                           ,"");
                                bVar2 = Compile(this,(string *)local_1d0);
                                if ((ostream *)local_1d0._0_8_ != this_00) {
                                  operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                                }
                                if (bVar2) {
                                  local_1d0._0_8_ = this_00;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_1d0,
                                             "\nbuffer b {\n  vec4 x[10];\n};\nvoid main() {\n  vec4 y = vec4(x);\n}"
                                             ,"");
                                  bVar2 = Compile(this,(string *)local_1d0);
                                  if ((ostream *)local_1d0._0_8_ != this_00) {
                                    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                                  }
                                  lVar5 = (ulong)bVar2 - 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		GLint bindings;
		glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &bindings);

		//  initialization of buffer block member 'x' not allowed
		if (!Compile(NL "buffer Buffer { int x = 10; };" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  syntax error, unexpected '-', expecting integer constant or unsigned integer constant at token "-"
		if (!Compile(Shader1(-1)))
			return ERROR;
		//  invalid value 96 for layout specifier 'binding'
		if (!Compile(Shader1(bindings)))
			return ERROR;

		//  invalid value 98 for layout specifier 'binding'
		if (!Compile(Shader2(bindings - 2)))
			return ERROR;

		//  OpenGL does not allow declaring buffer variable 'x' in the global scope. Use buffer blocks instead
		if (!Compile(NL "buffer int x;" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		// OpenGL requires buffer variables to be declared in a shader storage block in the global scope
		if (!Compile(NL "buffer Buffer { int y; };" NL "void main() {" NL "  y = 0;" NL "  buffer int x = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow a parameter to be a buffer
		if (!Compile(NL "buffer Buffer { int y; };" NL "void Modify(buffer int a) {" NL "  atomicAdd(a, 1);" NL "}" NL
						"void main() {" NL "  Modify(y);" NL "}"))
			return ERROR;

		//  layout specifier 'std430', incompatible with 'uniform blocks'
		if (!Compile(NL "layout(std430) uniform UBO { int x; };" NL "buffer SSBO { int y; };" NL "void main() {" NL
						"  y = x;" NL "}"))
			return ERROR;

		//  unknown layout specifier 'std430'
		if (!Compile(NL "buffer SSBO {" NL "  layout(std430) int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  unknown layout specifier 'binding = 1'
		if (!Compile(NL "buffer SSBO {" NL "  layout(binding = 1) int x;" NL "};" NL "void main() {" NL "  x = 0;" NL
						"}"))
			return ERROR;

		//  OpenGL does not allow writing to readonly variable 'x'
		if (!Compile(NL "readonly buffer SSBO {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow reading writeonly variable 'y'
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "writeonly buffer SSBO2 {" NL "  int y;" NL "};" NL
						"void main() {" NL "  x = y;" NL "}"))
			return ERROR;

		//  OpenGL does not allow writing to readonly variable 'z'
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "buffer SSBO2 {" NL "  writeonly int y;" NL
						"  readonly int z;" NL "};" NL "void main() {" NL "  x = y;" NL "  z = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow having both readonly and writeonly qualifiers on a variable
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "readonly buffer SSBO2 {" NL "  writeonly int y;" NL
						"};" NL "void main() {" NL "  x = y;" NL "}"))
			return ERROR;

		// ["layout(binding = 1) buffer;" should cause compile-time error
		if (!Compile(NL "layout(binding = 1) buffer;" NL "buffer SSBO {" NL "  int x;" NL "};" NL "void main() {" NL
						"  x = 0;" NL "}"))
			return ERROR;

		// ["  atomicAdd(y, 2);"  should cause compile-time error
		if (!Compile(NL "buffer Buffer { int x; };" NL "int y;" NL "void main() {" NL "  atomicAdd(x, 1);" NL
						"  atomicAdd(y, 2);" //
					 NL "}"))
			return ERROR;

		if (!Compile( // can't construct vector from an array
				NL "buffer b {" NL "  vec4 x[10];" NL "};" NL "void main() {" NL "  vec4 y = vec4(x);" NL "}"))
			return ERROR;

		return NO_ERROR;
	}